

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

SUNErrCode N_VEnableFusedOps_ManyVector(N_Vector v,int tf)

{
  int tf_local;
  N_Vector v_local;
  
  if (tf == 0) {
    v->ops->nvlinearcombination = (_func_SUNErrCode_int_sunrealtype_ptr_N_Vector_ptr_N_Vector *)0x0;
    v->ops->nvscaleaddmulti =
         (_func_SUNErrCode_int_sunrealtype_ptr_N_Vector_N_Vector_ptr_N_Vector_ptr *)0x0;
    v->ops->nvdotprodmulti = (_func_SUNErrCode_int_N_Vector_N_Vector_ptr_sunrealtype_ptr *)0x0;
    v->ops->nvlinearsumvectorarray =
         (_func_SUNErrCode_int_sunrealtype_N_Vector_ptr_sunrealtype_N_Vector_ptr_N_Vector_ptr *)0x0;
    v->ops->nvscalevectorarray =
         (_func_SUNErrCode_int_sunrealtype_ptr_N_Vector_ptr_N_Vector_ptr *)0x0;
    v->ops->nvconstvectorarray = (_func_SUNErrCode_int_sunrealtype_N_Vector_ptr *)0x0;
    v->ops->nvwrmsnormvectorarray =
         (_func_SUNErrCode_int_N_Vector_ptr_N_Vector_ptr_sunrealtype_ptr *)0x0;
    v->ops->nvwrmsnormmaskvectorarray =
         (_func_SUNErrCode_int_N_Vector_ptr_N_Vector_ptr_N_Vector_sunrealtype_ptr *)0x0;
    v->ops->nvscaleaddmultivectorarray =
         (_func_SUNErrCode_int_int_sunrealtype_ptr_N_Vector_ptr_N_Vector_ptr_ptr_N_Vector_ptr_ptr *)
         0x0;
    v->ops->nvlinearcombinationvectorarray =
         (_func_SUNErrCode_int_int_sunrealtype_ptr_N_Vector_ptr_ptr_N_Vector_ptr *)0x0;
    v->ops->nvdotprodmultilocal = (_func_SUNErrCode_int_N_Vector_N_Vector_ptr_sunrealtype_ptr *)0x0;
  }
  else {
    v->ops->nvlinearcombination = N_VLinearCombination_ManyVector;
    v->ops->nvscaleaddmulti = N_VScaleAddMulti_ManyVector;
    v->ops->nvdotprodmulti = N_VDotProdMulti_ManyVector;
    v->ops->nvlinearsumvectorarray = N_VLinearSumVectorArray_ManyVector;
    v->ops->nvscalevectorarray = N_VScaleVectorArray_ManyVector;
    v->ops->nvconstvectorarray = N_VConstVectorArray_ManyVector;
    v->ops->nvwrmsnormvectorarray = N_VWrmsNormVectorArray_ManyVector;
    v->ops->nvwrmsnormmaskvectorarray = N_VWrmsNormMaskVectorArray_ManyVector;
    v->ops->nvscaleaddmultivectorarray =
         (_func_SUNErrCode_int_int_sunrealtype_ptr_N_Vector_ptr_N_Vector_ptr_ptr_N_Vector_ptr_ptr *)
         0x0;
    v->ops->nvlinearcombinationvectorarray =
         (_func_SUNErrCode_int_int_sunrealtype_ptr_N_Vector_ptr_ptr_N_Vector_ptr *)0x0;
    v->ops->nvdotprodmultilocal = N_VDotProdMultiLocal_ManyVector;
  }
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VEnableFusedOps)(N_Vector v, sunbooleantype tf)
{
  if (tf)
  {
    /* enable all fused vector operations */
    v->ops->nvlinearcombination = MVAPPEND(N_VLinearCombination);
    v->ops->nvscaleaddmulti     = MVAPPEND(N_VScaleAddMulti);
    v->ops->nvdotprodmulti      = MVAPPEND(N_VDotProdMulti);
    /* enable all vector array operations */
    v->ops->nvlinearsumvectorarray     = MVAPPEND(N_VLinearSumVectorArray);
    v->ops->nvscalevectorarray         = MVAPPEND(N_VScaleVectorArray);
    v->ops->nvconstvectorarray         = MVAPPEND(N_VConstVectorArray);
    v->ops->nvwrmsnormvectorarray      = MVAPPEND(N_VWrmsNormVectorArray);
    v->ops->nvwrmsnormmaskvectorarray  = MVAPPEND(N_VWrmsNormMaskVectorArray);
    v->ops->nvscaleaddmultivectorarray = NULL;
    v->ops->nvlinearcombinationvectorarray = NULL;
    /* enable single buffer reduction operations */
    v->ops->nvdotprodmultilocal = MVAPPEND(N_VDotProdMultiLocal);
  }
  else
  {
    /* disable all fused vector operations */
    v->ops->nvlinearcombination = NULL;
    v->ops->nvscaleaddmulti     = NULL;
    v->ops->nvdotprodmulti      = NULL;
    /* disable all vector array operations */
    v->ops->nvlinearsumvectorarray         = NULL;
    v->ops->nvscalevectorarray             = NULL;
    v->ops->nvconstvectorarray             = NULL;
    v->ops->nvwrmsnormvectorarray          = NULL;
    v->ops->nvwrmsnormmaskvectorarray      = NULL;
    v->ops->nvscaleaddmultivectorarray     = NULL;
    v->ops->nvlinearcombinationvectorarray = NULL;
    /* disable single buffer reduction operations */
    v->ops->nvdotprodmultilocal = NULL;
  }

  /* return success */
  return SUN_SUCCESS;
}